

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_doing(connectdata *conn,_Bool *dophase_done)

{
  _Bool *done;
  CURLcode CVar1;
  
  if (((conn->handler->flags & 1) != 0) && ((conn->proto).imapc.ssldone == false)) {
    done = &(conn->proto).imapc.ssldone;
    CVar1 = Curl_ssl_connect_nonblocking(conn,0,done);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (*done != true) {
      return CURLE_OK;
    }
  }
  CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
  *dophase_done = (conn->proto).imapc.state == IMAP_STOP;
  return CVar1;
}

Assistant:

static CURLcode pop3_doing(struct connectdata *conn, bool *dophase_done)
{
  CURLcode result = pop3_multi_statemach(conn, dophase_done);

  if(result)
    DEBUGF(infof(conn->data, "DO phase failed\n"));
  else if(*dophase_done) {
    result = pop3_dophase_done(conn, FALSE /* not connected */);

    DEBUGF(infof(conn->data, "DO phase is complete\n"));
  }

  return result;
}